

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::clone_from(Mat *this,Mat *mat,Allocator *allocator)

{
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  Mat *in_RDI;
  void *in_R8;
  Mat *this_00;
  Mat local_60;
  
  this_00 = &local_60;
  clone(this_00,in_RSI,in_RDX,in_ECX,in_R8);
  operator=(this_00,in_RDI);
  ~Mat((Mat *)0x14af8a);
  return;
}

Assistant:

void Mat::clone_from(const ncnn::Mat& mat, Allocator* allocator)
{
    *this = mat.clone(allocator);
}